

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::anon_unknown_0::CUnescapeInternal
          (anon_unknown_0 *this,string_view source,bool leave_nulls_escaped,
          Nonnull<std::string_*> dest,Nullable<std::string_*> error)

{
  byte bVar1;
  anon_unknown_0 *this_00;
  size_t sVar2;
  bool bVar3;
  size_type new_size;
  undefined7 in_register_00000009;
  string_view source_00;
  Nullable<std::string_*> in_stack_ffffffffffffff98;
  ulong local_40;
  ptrdiff_t dest_size;
  Nullable<std::string_*> error_local;
  Nonnull<std::string_*> dest_local;
  undefined1 auStack_20 [7];
  bool leave_nulls_escaped_local;
  string_view source_local;
  
  source_local._M_len = source._M_len;
  dest_local._7_1_ = (byte)source._M_str & 1;
  dest_size = (ptrdiff_t)dest;
  error_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT71(in_register_00000009,leave_nulls_escaped);
  _auStack_20 = this;
  new_size = std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(in_register_00000009,leave_nulls_escaped),new_size);
  sVar2 = source_local._M_len;
  this_00 = _auStack_20;
  bVar1 = dest_local._7_1_;
  bVar3 = (bool)std::__cxx11::string::operator[]((ulong)error_local);
  source_00._M_str._0_1_ = bVar1 & 1;
  source_00._M_len = sVar2;
  source_00._M_str._1_7_ = 0;
  bVar3 = CUnescapeInternal(this_00,source_00,bVar3,(Nonnull<char_*>)&local_40,
                            (Nonnull<ptrdiff_t_*>)dest_size,in_stack_ffffffffffffff98);
  if (bVar3) {
    std::__cxx11::string::erase((ulong)error_local,local_40);
  }
  return bVar3;
}

Assistant:

bool CUnescapeInternal(absl::string_view source, bool leave_nulls_escaped,
                       absl::Nonnull<std::string*> dest,
                       absl::Nullable<std::string*> error) {
  strings_internal::STLStringResizeUninitialized(dest, source.size());

  ptrdiff_t dest_size;
  if (!CUnescapeInternal(source,
                         leave_nulls_escaped,
                         &(*dest)[0],
                         &dest_size,
                         error)) {
    return false;
  }
  dest->erase(static_cast<size_t>(dest_size));
  return true;
}